

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# segment_o2.cc
# Opt level: O0

MatrixXd * __thiscall
lf::geometry::SegmentO2::Jacobian(MatrixXd *__return_storage_ptr__,SegmentO2 *this,MatrixXd *local)

{
  bool bVar1;
  runtime_error *this_00;
  bool local_3a9;
  double local_3a8;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
  local_3a0;
  Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>
  local_370;
  ConstColwiseReturnType local_338;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>,_const_Eigen::Replicate<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1,__1>_>
  local_300;
  string local_2a0;
  allocator<char> local_279;
  string local_278;
  allocator<char> local_251;
  string local_250;
  stringstream local_220 [8];
  stringstream ss;
  ostream local_210 [376];
  Scalar local_98;
  NestedExpressionType local_90;
  CmpLEReturnType local_88;
  NestedExpressionType local_60;
  Scalar local_58;
  RCmpLEReturnType local_50;
  MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *local_20;
  MatrixXd *local_local;
  SegmentO2 *this_local;
  
  local_58 = 0.0;
  local_20 = (MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local;
  local_local = (MatrixXd *)this;
  this_local = (SegmentO2 *)__return_storage_ptr__;
  local_60 = (NestedExpressionType)
             Eigen::MatrixBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::array
                       ((MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local);
  Eigen::operator<=(&local_50,&local_58,
                    (ArrayBase<Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                     *)&local_60);
  bVar1 = Eigen::
          DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_cmp_op<double,_double,_(Eigen::internal::ComparisonName)2>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Array<double,_-1,_-1,_0,_-1,_-1>_>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>_>
          ::all((DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_cmp_op<double,_double,_(Eigen::internal::ComparisonName)2>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Array<double,__1,__1,_0,__1,__1>_>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>
                 *)&local_50);
  local_3a9 = false;
  if (bVar1) {
    local_90 = (NestedExpressionType)
               Eigen::MatrixBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::array(local_20);
    local_98 = 1.0;
    Eigen::ArrayBase<Eigen::ArrayWrapper<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>::
    operator<=(&local_88,
               (ArrayBase<Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_> *)
               &local_90,&local_98);
    local_3a9 = Eigen::
                DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_cmp_op<double,_double,_(Eigen::internal::ComparisonName)2>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Array<double,_-1,_-1,_0,_-1,_-1>_>_>_>
                ::all((DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_cmp_op<double,_double,_(Eigen::internal::ComparisonName)2>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Array<double,__1,__1,_0,__1,__1>_>_>_>
                       *)&local_88);
  }
  if (((local_3a9 ^ 0xffU) & 1) != 0) {
    std::__cxx11::stringstream::stringstream(local_220);
    std::operator<<(local_210,"local coordinates out of bounds for reference element");
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_250,"(0. <= local.array()).all() && (local.array() <= 1.).all()",
               &local_251);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_278,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/geometry/segment_o2.cc"
               ,&local_279);
    std::__cxx11::stringstream::str();
    lf::base::AssertionFailed(&local_250,&local_278,0x29,&local_2a0);
    std::__cxx11::string::~string((string *)&local_2a0);
    std::__cxx11::string::~string((string *)&local_278);
    std::allocator<char>::~allocator(&local_279);
    std::__cxx11::string::~string((string *)&local_250);
    std::allocator<char>::~allocator(&local_251);
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"this code should not be reached");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_3a8 = 2.0;
  Eigen::operator*(&local_3a0,&local_3a8,(StorageBaseType *)&this->alpha_);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,-1,1,0,-1,1>const>const,Eigen::Matrix<double,-1,1,0,-1,1>const>>
  ::operator*(&local_370,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::Matrix<double,_1,1,0,_1,1>const>>
               *)&local_3a0,local_20);
  Eigen::
  DenseBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>_>
  ::colwise(&local_338,
            (DenseBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>_>
             *)&local_370);
  Eigen::
  VectorwiseOp<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,-1,1,0,-1,1>const>const,Eigen::Matrix<double,-1,1,0,-1,1>const>,Eigen::Matrix<double,-1,-1,0,-1,-1>,0>const,0>
  ::operator+(&local_300,
              (VectorwiseOp<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::Matrix<double,_1,1,0,_1,1>const>,Eigen::Matrix<double,_1,_1,0,_1,_1>,0>const,0>
               *)&local_338,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&this->beta_);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::
  Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::Matrix<double,_1,1,0,_1,1>const>,Eigen::Matrix<double,_1,_1,0,_1,_1>,0>const,Eigen::Replicate<Eigen::Matrix<double,_1,1,0,_1,1>,1,_1>const>>
            ((Matrix<double,_1,_1,0,_1,_1> *)__return_storage_ptr__,
             (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>,_const_Eigen::Replicate<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1,__1>_>_>
              *)&local_300);
  return __return_storage_ptr__;
}

Assistant:

Eigen::MatrixXd SegmentO2::Jacobian(const Eigen::MatrixXd& local) const {
  LF_VERIFY_MSG((0. <= local.array()).all() && (local.array() <= 1.).all(),
                "local coordinates out of bounds for reference element");

  return (2. * alpha_ * local).colwise() + beta_;
}